

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::LinkedModel::LinkedModel(LinkedModel *this,LinkedModel *from)

{
  void *pvVar1;
  LinkedModelFile *this_00;
  LinkedModelFile *from_00;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__LinkedModel_003c5ba0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 1) {
    this->_oneof_case_[0] = 1;
    this_00 = (LinkedModelFile *)operator_new(0x28);
    LinkedModelFile::LinkedModelFile(this_00);
    (this->LinkType_).linkedmodelfile_ = this_00;
    if (from->_oneof_case_[0] == 1) {
      from_00 = (from->LinkType_).linkedmodelfile_;
    }
    else {
      protobuf_LinkedModel_2eproto::InitDefaults();
      from_00 = (LinkedModelFile *)&_LinkedModelFile_default_instance_;
    }
    LinkedModelFile::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

LinkedModel::LinkedModel(const LinkedModel& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_LinkType();
  switch (from.LinkType_case()) {
    case kLinkedModelFile: {
      mutable_linkedmodelfile()->::CoreML::Specification::LinkedModelFile::MergeFrom(from.linkedmodelfile());
      break;
    }
    case LINKTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.LinkedModel)
}